

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::encode_query_param(string *__return_storage_ptr__,string *value)

{
  uint *puVar1;
  byte bVar2;
  long lVar3;
  pointer pcVar4;
  size_type sVar5;
  int iVar6;
  ostream *this;
  size_type sVar7;
  uint uVar8;
  ostringstream escaped;
  uint auStack_190 [50];
  undefined1 auStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&escaped);
  lVar3 = *(long *)(_escaped + -0x18);
  std::ios::fill();
  auStack_c8[lVar3] = 0x30;
  *(uint *)((long)auStack_190 + *(long *)(_escaped + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_escaped + -0x18)) & 0xffffffb5 | 8;
  pcVar4 = (value->_M_dataplus)._M_p;
  sVar5 = value->_M_string_length;
  for (sVar7 = 0; sVar5 != sVar7; sVar7 = sVar7 + 1) {
    bVar2 = pcVar4[sVar7];
    uVar8 = (uint)bVar2;
    iVar6 = isalnum(uVar8);
    if ((iVar6 == 0) &&
       (((0x3e < uVar8 - 0x21 || ((0x40000000000033c1U >> ((ulong)(uVar8 - 0x21) & 0x3f) & 1) == 0))
        && (bVar2 != 0x7e)))) {
      puVar1 = (uint *)((long)auStack_190 + *(long *)(_escaped + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      this = std::operator<<((ostream *)&escaped,'%');
      *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 2;
      std::ostream::operator<<(this,uVar8);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(_escaped + -0x18));
      *puVar1 = *puVar1 & 0xffffbfff;
    }
    else {
      std::operator<<((ostream *)&escaped,bVar2);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&escaped);
  return __return_storage_ptr__;
}

Assistant:

inline std::string encode_query_param(const std::string &value) {
  std::ostringstream escaped;
  escaped.fill('0');
  escaped << std::hex;

  for (auto c : value) {
    if (std::isalnum(static_cast<uint8_t>(c)) || c == '-' || c == '_' ||
        c == '.' || c == '!' || c == '~' || c == '*' || c == '\'' || c == '(' ||
        c == ')') {
      escaped << c;
    } else {
      escaped << std::uppercase;
      escaped << '%' << std::setw(2)
              << static_cast<int>(static_cast<unsigned char>(c));
      escaped << std::nouppercase;
    }
  }

  return escaped.str();
}